

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::SetPropertyWithAttributes
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  int *piVar1;
  byte bVar2;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  Type *pTVar3;
  RecyclerWeakReference<Js::DynamicObject> *pRVar4;
  JavascriptLibrary *pJVar5;
  code *pcVar6;
  PropertyRecord *this_01;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_02;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  uint32 index;
  int iVar10;
  BOOL BVar11;
  PropertyId propertyId_00;
  undefined4 *puVar12;
  JavascriptString **ppJVar13;
  DictionaryTypeHandlerBase<int> *pDVar14;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this_03;
  SimpleDictionaryPropertyDescriptor<int> *unaff_R13;
  ulong uVar15;
  DynamicObject *pDVar16;
  PropertyRecord *local_60;
  PropertyRecord *propertyRecord;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_50;
  int propertyIndex;
  uint local_3c;
  Var local_38;
  
  _propertyIndex = info;
  local_38 = value;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    unaff_R13 = (SimpleDictionaryPropertyDescriptor<int> *)__tls_get_addr(&PTR_0155fe48);
    *(undefined4 *)unaff_R13 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92a,"(instance)","instance");
    if (!bVar8) goto LAB_00df9991;
    *(undefined4 *)unaff_R13 = 0;
  }
  propertyRecord =
       (PropertyRecord *)
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    unaff_R13 = (SimpleDictionaryPropertyDescriptor<int> *)__tls_get_addr(&PTR_0155fe48);
    *(undefined4 *)unaff_R13 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92f,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar8) goto LAB_00df9991;
    *(undefined4 *)unaff_R13 = 0;
  }
  local_3c = propertyId;
  local_60 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  this_00 = (this->propertyMap).ptr;
  uVar9 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,&local_60);
  uVar7 = local_3c;
  if (-1 < (int)uVar9) {
    unaff_R13 = (SimpleDictionaryPropertyDescriptor<int> *)((this_00->entries).ptr + uVar9);
  }
  uVar15 = (ulong)local_3c;
  if ((int)uVar9 < 0) {
    if (local_60->isNumeric != true) {
      BVar11 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
               AddProperty<Js::PropertyRecord_const*>
                         ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                          instance,local_60,local_38,attributes,_propertyIndex,flags,
                          possibleSideEffects);
      return BVar11;
    }
    index = PropertyRecord::GetNumericValue(local_60);
    BVar11 = DynamicTypeHandler::SetItemWithAttributes
                       (&this->super_DynamicTypeHandler,instance,index,local_38,attributes);
    return BVar11;
  }
  if ((unaff_R13->Attributes & 0x10) != (attributes & 0x10)) {
    pDVar14 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
              ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<int>,Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                         instance);
    piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->
              convertSimpleDictionaryToDictionaryCount;
    *piVar1 = *piVar1 + 1;
    iVar10 = (*(pDVar14->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                       (pDVar14,instance,uVar15,local_38,(ulong)attributes,_propertyIndex,
                        (ulong)flags,(ulong)possibleSideEffects);
    return iVar10;
  }
  if ((unaff_R13->Attributes & 0x18) == 8) {
    bVar2 = (this->super_DynamicTypeHandler).flags;
    if ((bVar2 & 4) == 0) {
      pTVar3 = (instance->super_RecyclableObject).type.ptr;
      if (*(char *)&pTVar3[1].javascriptLibrary.ptr == '\x01') {
        if (((bVar2 & 0x10) != 0) ||
           (*(char *)((long)&pTVar3[1].javascriptLibrary.ptr + 1) == '\x01')) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x960,
                                      "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                      ,
                                      "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()"
                                     );
          if (!bVar8) goto LAB_00df9991;
          *puVar12 = 0;
        }
        DynamicObject::ChangeType(instance);
      }
      if (((this->field_0x28 & 2) != 0) &&
         (bVar8 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>::
                  TryUndeleteProperty((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>
                                       *)this,instance,unaff_R13->propertyIndex,(int *)&local_50),
         bVar8)) {
        ppJVar13 = JsUtil::
                   BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetKeyAt((this->propertyMap).ptr,(int)local_50);
        bVar8 = PropertyRecordStringHashComparer<Js::JavascriptString_*>::Equals(*ppJVar13,local_60)
        ;
        if (!bVar8) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x96b,
                                      "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord))"
                                      ,
                                      "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord)"
                                     );
          if (!bVar8) goto LAB_00df9991;
          *puVar12 = 0;
        }
        unaff_R13 = JsUtil::
                    BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                    ::GetReferenceAt((this->propertyMap).ptr,(int)local_50);
      }
      bVar8 = SupportsSwitchingToUnordered(this,(ScriptContext *)propertyRecord);
      if (bVar8) {
        this->numDeletedProperties = this->numDeletedProperties + 0xff;
      }
      ScriptContext::InvalidateProtoCaches((ScriptContext *)propertyRecord,uVar7);
      unaff_R13->Attributes = '\a';
      goto LAB_00df9502;
    }
LAB_00df964c:
    this_03 = ConvertToNonSharedSimpleDictionaryType(this,instance);
    BVar11 = SetPropertyWithAttributes
                       (this_03,instance,uVar7,local_38,attributes,_propertyIndex,flags,
                        possibleSideEffects);
  }
  else {
LAB_00df9502:
    if (unaff_R13->Attributes != attributes) {
      bVar2 = (this->super_DynamicTypeHandler).flags;
      if ((bVar2 & 4) != 0) goto LAB_00df964c;
      pTVar3 = (instance->super_RecyclableObject).type.ptr;
      if (*(char *)&pTVar3[1].javascriptLibrary.ptr == '\x01') {
        if (((bVar2 & 0x10) != 0) ||
           (*(char *)((long)&pTVar3[1].javascriptLibrary.ptr + 1) == '\x01')) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x997,
                                      "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                      ,
                                      "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()"
                                     );
          if (!bVar8) goto LAB_00df9991;
          *puVar12 = 0;
        }
        DynamicObject::ChangeType(instance);
      }
      unaff_R13->Attributes = attributes;
    }
    if (unaff_R13->propertyIndex != -1) {
      pRVar4 = (this->singletonInstance).ptr;
      if (pRVar4 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
        pDVar16 = (DynamicObject *)0x0;
      }
      else {
        pDVar16 = (DynamicObject *)(pRVar4->super_RecyclerWeakReferenceBase).strongRef;
      }
      if (pDVar16 != instance && pRVar4 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9a5,
                                    "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                    ,
                                    "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                   );
        if (!bVar8) goto LAB_00df9991;
        *puVar12 = 0;
      }
      if ((*(byte *)unaff_R13 & 2) == 0) {
        if ((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
            (*(byte *)unaff_R13 = *(byte *)unaff_R13 | 2, pDVar16 == instance)) &&
           ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
            PropertyOperation_None && 0xf < local_3c)) {
          if (((this->super_DynamicTypeHandler).flags & 0x10) != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar12 = 1;
            bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                        ,0x9af,"(!GetIsShared())","!GetIsShared()");
            if (!bVar8) goto LAB_00df9991;
            *puVar12 = 0;
          }
          if (local_38 == (Var)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar12 = 1;
            bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                        ,0x9b0,"(value != nullptr)","value != nullptr");
            if (!bVar8) goto LAB_00df9991;
            *puVar12 = 0;
          }
          BVar11 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
          uVar7 = local_3c;
          if (BVar11 != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar12 = 1;
            bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                        ,0x9b2,"(!instance->IsExternal())","!instance->IsExternal()"
                                       );
            if (!bVar8) {
LAB_00df9991:
              pcVar6 = (code *)invalidInstructionException();
              (*pcVar6)();
            }
            *puVar12 = 0;
          }
          bVar8 = VarIs<Js::JavascriptFunction>(local_38);
          if (bVar8) {
            bVar8 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixMethodPropsPhase);
            bVar8 = !bVar8;
          }
          else {
            bVar8 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixDataPropsPhase);
            if (bVar8) {
              bVar8 = false;
            }
            else {
              bVar8 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,uVar7,local_38);
            }
          }
          *(byte *)unaff_R13 = *(byte *)unaff_R13 & 0xfb | bVar8 << 2;
        }
      }
      else {
        SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
        InvalidateFixedField<Js::PropertyRecord_const*>
                  ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,local_60
                   ,unaff_R13,
                   (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                   super_JavascriptLibraryBase).scriptContext.ptr);
      }
      DynamicTypeHandler::SetSlotUnchecked(instance,unaff_R13->propertyIndex,local_38);
      if (_propertyIndex != (PropertyValueInfo *)0x0) {
        _propertyIndex->m_instance = &instance->super_RecyclableObject;
        _propertyIndex->m_propertyIndex = 0xffff;
        _propertyIndex->m_attributes = '\0';
        _propertyIndex->flags = InlineCacheNoFlags;
      }
    }
    if ((unaff_R13->Attributes & 1) != 0) {
      DynamicObject::SetHasNoEnumerableProperties(instance,false);
    }
    pJVar5 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
    Memory::Recycler::WBSetBit((char *)&local_50);
    local_50 = &pJVar5->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
    uVar7 = local_3c;
    this_02 = local_50;
    if (((unaff_R13->Attributes & 4) == 0) &&
       (DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false),
       this_01 = propertyRecord, ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
      propertyId_00 =
           DynamicTypeHandler::TMapKey_GetPropertyId((ScriptContext *)propertyRecord,uVar7);
      ScriptContext::InvalidateStoreFieldCaches((ScriptContext *)this_01,propertyId_00);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_02);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,uVar7,local_38,possibleSideEffects);
    BVar11 = 1;
  }
  return BVar11;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & PropertyOperation_ThrowIfNotExtensible) != 0;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((attributes & PropertyLetConstGlobal) != (descriptor->Attributes & PropertyLetConstGlobal))
            {
                // We have a shadowing case here.  Either a let/const is being declared
                // that shadows an undeclared global property or an undeclared global
                // property is being added after a let/const was already declared.
                //
                // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
                // because we do not want to add another property index field to the
                // property descriptors.  Instead convert to DictionaryTypeHandler
                // where it will reuse one of the getter/setter fields on its
                // property descriptor type.
                //
                // An exception is in the language service that will sometimes execute
                // the glo function twice causing a const or let appear to shadow itself.
                // In this case setting the property is also right.
                return
                    ConvertToDictionaryType(instance)
                        ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
            }

            if (descriptor->Attributes & PropertyDeleted && !(descriptor->Attributes & PropertyLetConstGlobal))
            {
                Assert((descriptor->Attributes & PropertyLetConstGlobal) == 0);
                if(GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else if (instance->GetDynamicType()->GetIsLocked())
                {
                    Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                    // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                    instance->ChangeType();
                }

                if(isUnordered)
                {
                    TPropertyIndex propertyIndex;
                    if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                    {
                        Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord));
                        descriptor = propertyMap->GetReferenceAt(propertyIndex);
                    }
                }

                if (IsNotExtensibleSupported)
                {
                    bool isForce = (flags & PropertyOperation_Force) != 0;
                    if (!isForce)
                    {
                        if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                        {
                            return FALSE;
                        }
                    }
                }

                if(SupportsSwitchingToUnordered(scriptContext))
                {
                    --numDeletedProperties;
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                descriptor->Attributes = PropertyDynamicTypeDefaults;
            }

            if (descriptor->Attributes != attributes)
            {
                if (GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else
                {
                    if (instance->GetDynamicType()->GetIsLocked())
                    {
                        Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                        // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                        instance->ChangeType();
                    }

                    descriptor->Attributes = attributes;
                }
            }

            if (descriptor->propertyIndex != NoSlots)
            {
#if ENABLE_FIXED_FIELDS
                DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
                Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
                if (!descriptor->isInitialized)
                {
                    if ((flags & PropertyOperation_PreInit) == 0)
                    {
                        // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                        // some other special illegal value (for let or const), currently == null.
                        descriptor->isInitialized = true;
                        if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) && (flags & (PropertyOperation_SpecialValue | PropertyOperation_NonFixedValue)) == 0)
                        {
                            Assert(!GetIsShared());
                            Assert(value != nullptr);
                            // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                            Assert(!instance->IsExternal());
                            descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                        }
                    }
                }
                else
                {
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
                }
#endif
                SetSlotUnchecked(instance, descriptor->propertyIndex, value);

                if (!descriptor->IsOrMayBecomeFixed())
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
            }

            if (descriptor->Attributes & PropertyEnumerable)
            {
                instance->SetHasNoEnumerableProperties(false);
            }

            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);

            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyRecord. May create objectArray.
        if (propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetItemWithAttributes(instance, propertyRecord->GetNumericValue(), value, attributes);
        }

        return this->AddProperty(instance, propertyRecord, value, attributes, info, flags, possibleSideEffects);
    }